

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall QFSFileEnginePrivate::nativeSyncToDisk(QFSFileEnginePrivate *this)

{
  int iVar1;
  int *piVar2;
  
  while( true ) {
    if ((FILE *)this->fh == (FILE *)0x0) {
      iVar1 = this->fd;
    }
    else {
      iVar1 = fileno((FILE *)this->fh);
    }
    iVar1 = fdatasync(iVar1);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
LAB_00171650:
      nativeSyncToDisk();
      return false;
    }
  }
  if (iVar1 == 0) {
    return true;
  }
  __errno_location();
  goto LAB_00171650;
}

Assistant:

bool QFSFileEnginePrivate::nativeSyncToDisk()
{
    Q_Q(QFSFileEngine);
    int ret;
#if defined(_POSIX_SYNCHRONIZED_IO) && _POSIX_SYNCHRONIZED_IO > 0
    QT_EINTR_LOOP(ret, fdatasync(nativeHandle()));
#else
    QT_EINTR_LOOP(ret, fsync(nativeHandle()));
#endif
    if (ret != 0)
        q->setError(QFile::WriteError, qt_error_string(errno));
    return ret == 0;
}